

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_5c813::schema::make
          (schema *this,json *schema,root_schema *root,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  json *ptr;
  json_pointer<std::__cxx11::string> *this_00;
  value_t vVar3;
  pointer pbVar4;
  json_uri *pjVar5;
  size_type sVar6;
  _func_int **pp_Var7;
  pointer pjVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  iterator iVar14;
  undefined4 uVar15;
  bool bVar16;
  int iVar17;
  schema *__tmp;
  iterator __position;
  root_schema *prVar18;
  reference pbVar19;
  __normal_iterator<nlohmann::json_uri_*,_std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>_>
  _Var20;
  string_t *psVar21;
  iterator iVar22;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *schema_00;
  iterator iVar23;
  _Rb_tree_node_base *p_Var24;
  ulong uVar25;
  byte extraout_var;
  schema_file *psVar26;
  iterator iVar27;
  byte extraout_var_00;
  _Rb_tree_node_base *p_Var28;
  iterator iVar29;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
  *this_01;
  string_type *key_00;
  pointer extraout_RAX;
  pointer pjVar30;
  invalid_argument *piVar31;
  long *plVar32;
  pointer keylen;
  undefined **ppuVar33;
  json_value *__k;
  root_schema *prVar34;
  root_schema *prVar35;
  object_t *poVar36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Base_ptr p_Var37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer field;
  _Base_ptr *pp_Var39;
  undefined8 uVar40;
  _Link_type __p;
  json_value jVar41;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *__args_2;
  pointer pjVar42;
  json_uri *uri;
  json_uri *pjVar43;
  schema *__tmp_1;
  _Manager_type *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar44;
  shared_ptr<(anonymous_namespace)::schema> sVar45;
  initializer_list<nlohmann::json_uri> __l;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *__range2;
  iterator result;
  bool ret;
  json_uri id;
  anon_class_32_4_9864ab46 findDefinitions;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2c8;
  root_schema *local_2a8;
  json_value local_2a0;
  iterator local_298;
  undefined1 auStack_290 [16];
  _Alloc_hider local_280;
  root_schema *prStack_278;
  string local_260 [32];
  string local_240 [32];
  pointer local_220;
  pointer pbStack_218;
  pointer local_210;
  string local_208 [32];
  json_value local_1e8;
  _Rb_tree_node_base *p_Stack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  schema local_1c8;
  undefined1 local_1a8 [192];
  string local_e8;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_c8;
  anon_class_32_4_9864ab46 local_b0;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_90;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  __position._M_current =
       (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)._M_impl.
       super__Vector_impl_data._M_start;
  keylen = (pointer)keys;
  __args_2 = uris;
  local_2a8 = root;
  if (__position._M_current !=
      (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar17 = std::__cxx11::string::compare((char *)&(__position._M_current)->identifier_);
      if (iVar17 == 0) {
        __position._M_current = __position._M_current + 1;
      }
      else {
        __position = std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::_M_erase
                               (uris,__position);
      }
    } while (__position._M_current !=
             (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  field = (keys->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (field != pbVar4) {
    do {
      pjVar5 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pjVar43 = (uris->
                     super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
                     _M_impl.super__Vector_impl_data._M_start; pjVar43 != pjVar5;
          pjVar43 = pjVar43 + 1) {
        nlohmann::json_uri::append((json_uri *)&local_2a0,pjVar43,field);
        std::__cxx11::string::operator=((string *)pjVar43,(string *)&local_2a0.boolean);
        std::__cxx11::string::operator=((string *)&pjVar43->scheme_,(string *)&local_280);
        std::__cxx11::string::operator=((string *)&pjVar43->authority_,local_260);
        std::__cxx11::string::operator=((string *)&pjVar43->path_,local_240);
        keylen = local_210;
        local_1a8._16_8_ =
             (pjVar43->pointer_).reference_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a8._0_8_ =
             (pjVar43->pointer_).reference_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1a8._8_8_ =
             (pjVar43->pointer_).reference_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pjVar43->pointer_).reference_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_220;
        (pjVar43->pointer_).reference_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbStack_218;
        (pjVar43->pointer_).reference_tokens.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_210;
        local_220 = (pointer)0x0;
        pbStack_218 = (pointer)0x0;
        local_210 = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a8);
        std::__cxx11::string::operator=((string *)&pjVar43->identifier_,local_208);
        nlohmann::json_uri::~json_uri((json_uri *)&local_2a0);
      }
      field = field + 1;
    } while (field != pbVar4);
  }
  this->_vptr_schema = (_func_int **)0x0;
  this->root_ = (root_schema *)0x0;
  if (schema->m_type != object) {
    if (schema->m_type != boolean) {
      piVar31 = (invalid_argument *)__cxa_allocate_exception(0x10);
      nlohmann::json_uri::to_string_abi_cxx11_
                ((string *)&local_1e8,
                 (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)
                 ._M_impl.super__Vector_impl_data._M_start);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "invalid JSON-type for a schema for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8
                    );
      plVar32 = (long *)std::__cxx11::string::append(local_1a8);
      local_2a0.object = (object_t *)*plVar32;
      poVar36 = (object_t *)(plVar32 + 2);
      if (local_2a0.object == poVar36) {
        lVar9 = *(long *)&(poVar36->_M_t)._M_impl;
        lVar13 = plVar32[3];
        auStack_290._0_4_ = (undefined4)lVar9;
        auStack_290._4_2_ = (undefined2)((ulong)lVar9 >> 0x20);
        auStack_290[6] = (undefined1)((ulong)lVar9 >> 0x30);
        auStack_290[7] = (undefined1)((ulong)lVar9 >> 0x38);
        auStack_290._8_3_ = (undefined3)lVar13;
        auStack_290[0xb] = (undefined1)((ulong)lVar13 >> 0x18);
        auStack_290._12_4_ = (undefined4)((ulong)lVar13 >> 0x20);
        local_2a0.object = (object_t *)auStack_290;
      }
      else {
        lVar9 = *(long *)&(poVar36->_M_t)._M_impl;
        auStack_290._0_4_ = (undefined4)lVar9;
        auStack_290._4_2_ = (undefined2)((ulong)lVar9 >> 0x20);
        auStack_290[6] = (undefined1)((ulong)lVar9 >> 0x30);
        auStack_290[7] = (undefined1)((ulong)lVar9 >> 0x38);
      }
      local_298._M_node = (_Base_ptr)plVar32[1];
      *plVar32 = (long)poVar36;
      plVar32[1] = 0;
      *(undefined1 *)(plVar32 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar31,(string *)&local_2a0.boolean);
      __cxa_throw(piVar31,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    prVar18 = (root_schema *)operator_new(0x38);
    *(undefined8 *)((long)&(prVar18->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar18->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_00163fe0;
    (prVar18->loader_)._M_invoker = (_Invoker_type)local_2a8;
    (prVar18->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar18->format_check_).super__Function_base._M_functor + 8) = 0;
    ppuVar33 = &PTR_make_for_default__00164030;
    (prVar18->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__00164030;
    local_2a0.number_unsigned = local_2a0.number_unsigned & 0xffffffffffffff00;
    nlohmann::json_abi_v3_11_2::detail::
    from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (schema,&local_2a0.boolean);
    prVar35 = (root_schema *)CONCAT71((int7)((ulong)ppuVar33 >> 8),local_2a0.boolean);
    *(boolean_t *)&(prVar18->format_check_).super__Function_base._M_manager = local_2a0.boolean;
    this->_vptr_schema = (_func_int **)&(prVar18->loader_).super__Function_base._M_manager;
    prVar34 = this->root_;
    this->root_ = prVar18;
    _Var38._M_pi = extraout_RDX;
    if (prVar34 != (root_schema *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar34);
      _Var38._M_pi = extraout_RDX_00;
    }
    goto LAB_0011b0e0;
  }
  local_2c8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_2c8.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_2c8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_2c8.m_object = schema;
  local_2c8.m_it.object_iterator._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
       ::_M_find_tr<char[4],void>
                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   *)(schema->m_value).object,(char (*) [4])"$id");
  local_298._M_node = (_Base_ptr)0x0;
  auStack_290._0_4_ = 0;
  auStack_290._4_2_ = 0;
  auStack_290[6] = '\0';
  auStack_290._7_4_ = 0;
  auStack_290._12_4_ = 0x80000000;
  if (schema->m_type == array) {
    sVar6 = ((schema->m_value).string)->_M_string_length;
    auStack_290._0_4_ = (undefined4)sVar6;
    auStack_290._4_2_ = (undefined2)(sVar6 >> 0x20);
    auStack_290[6] = (undefined1)(sVar6 >> 0x30);
    auStack_290[7] = (undefined1)(sVar6 >> 0x38);
    auStack_290._8_3_ = 0;
  }
  else if (schema->m_type == object) {
    local_298._M_node = &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    auStack_290._7_4_ = 0x100;
    auStack_290._12_4_ = 0;
  }
  auStack_290[0xb] = 0;
  local_2a0 = (json_value)schema;
  bVar16 = nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     (&local_2c8,
                      (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&local_2a0);
  if (!bVar16) {
    pjVar42 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pjVar8 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pbVar19 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_2c8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_2a0,pbVar19);
    _Var20 = std::
             __find_if<__gnu_cxx::__normal_iterator<nlohmann::json_uri*,std::vector<nlohmann::json_uri,std::allocator<nlohmann::json_uri>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pjVar42,pjVar8,&local_2a0);
    pjVar43 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((json *)local_2a0.object != (json *)auStack_290) {
      operator_delete(local_2a0.object,
                      CONCAT17(auStack_290[7],
                               CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)
                                       )) + 1);
    }
    if (_Var20._M_current == pjVar43) {
      pjVar42 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pbVar19 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_2c8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_1a8,pbVar19);
      nlohmann::json_uri::derive
                ((json_uri *)&local_2a0,(EVP_PKEY_CTX *)(pjVar42 + -1),local_1a8,(size_t *)keylen);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::
      emplace_back<nlohmann::json_uri>(uris,(json_uri *)&local_2a0);
      nlohmann::json_uri::~json_uri((json_uri *)&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
    }
    local_50.m_object = local_2c8.m_object;
    local_50.m_it.object_iterator._M_node = local_2c8.m_it.object_iterator._M_node;
    local_50.m_it.array_iterator._M_current = local_2c8.m_it.array_iterator._M_current;
    local_50.m_it.primitive_iterator.m_it = local_2c8.m_it.primitive_iterator.m_it;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
              ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&local_2a0,schema,&local_50);
  }
  local_b0.root = &local_2a8;
  auStack_290._0_4_ = 0x66656424;
  auStack_290._4_2_ = 0x73;
  local_298._M_node = (_Base_ptr)0x5;
  local_2a0.object = (object_t *)auStack_290;
  local_b0.attr = &local_2c8;
  local_b0.schema = schema;
  local_b0.uris = uris;
  bVar16 = make::anon_class_32_4_9864ab46::operator()(&local_b0,(string *)&local_2a0);
  if (local_2a0.object != (object_t *)auStack_290) {
    operator_delete(local_2a0.object,
                    CONCAT17(auStack_290[7],
                             CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)))
                    + 1);
  }
  if (!bVar16) {
    auStack_290._0_4_ = 0x69666564;
    auStack_290._4_2_ = 0x696e;
    auStack_290[6] = 't';
    auStack_290._7_4_ = 0x736e6f69;
    local_298._M_node = (_Base_ptr)0xb;
    auStack_290[0xb] = 0;
    local_2a0.object = (object_t *)auStack_290;
    make::anon_class_32_4_9864ab46::operator()(&local_b0,(string *)&local_2a0);
    if (local_2a0.object != (object_t *)auStack_290) {
      operator_delete(local_2a0.object,
                      CONCAT17(auStack_290[7],
                               CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)
                                       )) + 1);
    }
  }
  vVar3 = schema->m_type;
  __k = (json_value *)(ulong)vVar3;
  if (vVar3 == object) {
    local_2c8.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
         ::_M_find_tr<char[5],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     *)(schema->m_value).object,(char (*) [5])"$ref");
    __k = (json_value *)CONCAT71((int7)((ulong)__k >> 8),schema->m_type);
    local_2c8.m_it.primitive_iterator.m_it = -0x8000000000000000;
LAB_0011a768:
    local_2c8.m_it.array_iterator._M_current = (pointer)0x0;
    local_298._M_node = (_Rb_tree_node_base *)0x0;
    auStack_290._0_4_ = 0;
    auStack_290._4_2_ = 0;
    auStack_290[6] = '\0';
    auStack_290._7_4_ = 0;
    auStack_290._12_4_ = 0x80000000;
    if ((char)__k == '\x01') {
      local_298._M_node =
           &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      if (((uint)__k & 0xff) == 2) {
        psVar21 = (schema->m_value).string;
        goto LAB_0011a7b2;
      }
      auStack_290._7_4_ = 0x100;
      auStack_290._12_4_ = 0;
    }
  }
  else {
    if (vVar3 != array) {
      local_2c8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_2c8.m_it.primitive_iterator.m_it = 1;
      goto LAB_0011a768;
    }
    psVar21 = (schema->m_value).string;
    local_2c8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)psVar21->_M_string_length;
    local_2c8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    __k = (json_value *)0x8000000000000000;
    local_2c8.m_it.primitive_iterator.m_it = -0x8000000000000000;
LAB_0011a7b2:
    auStack_290._12_4_ = 0x80000000;
    local_298._M_node = (_Rb_tree_node_base *)0x0;
    sVar6 = psVar21->_M_string_length;
    auStack_290._0_4_ = (undefined4)sVar6;
    auStack_290._4_2_ = (undefined2)(sVar6 >> 0x20);
    auStack_290[6] = (undefined1)(sVar6 >> 0x30);
    auStack_290[7] = (undefined1)(sVar6 >> 0x38);
    auStack_290._8_3_ = 0;
  }
  auStack_290[0xb] = 0;
  local_2c8.m_object = schema;
  local_2a0 = (json_value)schema;
  bVar16 = nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     (&local_2c8,
                      (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&local_2a0);
  if (bVar16) {
    prVar18 = (root_schema *)operator_new(0xc0);
    *(undefined8 *)((long)&(prVar18->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar18->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_00164168;
    this_02 = &(prVar18->loader_).super__Function_base._M_manager;
    prVar35 = (root_schema *)uris;
    __gnu_cxx::new_allocator<(anonymous_namespace)::type_schema>::
    construct<(anonymous_namespace)::type_schema,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,nlohmann::json_schema::root_schema*&,std::vector<nlohmann::json_uri,std::allocator<nlohmann::json_uri>>&>
              ((new_allocator<(anonymous_namespace)::type_schema> *)this_02,(type_schema *)schema,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_2a8,(root_schema **)uris,__args_2);
    this->_vptr_schema = (_func_int **)this_02;
    prVar34 = this->root_;
    this->root_ = prVar18;
    if (prVar34 != (root_schema *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar34);
    }
  }
  else {
    pjVar42 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pbVar19 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_2c8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_2a0,pbVar19);
    nlohmann::json_uri::derive
              ((json_uri *)local_1a8,(EVP_PKEY_CTX *)(pjVar42 + -1),
               (uchar *)&local_2a0.number_unsigned,&__k->number_unsigned);
    if (local_2a0.object != (object_t *)auStack_290) {
      operator_delete(local_2a0.object,
                      CONCAT17(auStack_290[7],
                               CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)
                                       )) + 1);
    }
    prVar34 = local_2a8;
    nlohmann::json_uri::location_abi_cxx11_((string *)&local_2a0,(json_uri *)local_1a8);
    psVar26 = nlohmann::json_schema::root_schema::get_or_create_file(prVar34,(string *)&local_2a0);
    if (local_2a0.object != (object_t *)auStack_290) {
      operator_delete(local_2a0.object,
                      CONCAT17(auStack_290[7],
                               CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)
                                       )) + 1);
    }
    nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,(json_uri *)local_1a8);
    p_Var2 = &(psVar26->schemas)._M_t._M_impl.super__Rb_tree_header;
    iVar22 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
             ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)(psVar26->schemas)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent,(_Link_type)p_Var2,(_Base_ptr)&local_2a0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __k);
    iVar27._M_node = &p_Var2->_M_header;
    if (((_Rb_tree_header *)iVar22._M_node != p_Var2) &&
       (iVar17 = std::__cxx11::string::compare((string *)&local_2a0.boolean), iVar27 = iVar22,
       iVar17 < 0)) {
      iVar27._M_node = &p_Var2->_M_header;
    }
    if (local_2a0.object != (object_t *)auStack_290) {
      operator_delete(local_2a0.object,
                      CONCAT17(auStack_290[7],
                               CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)
                                       )) + 1);
    }
    if ((_Rb_tree_header *)iVar27._M_node == p_Var2) {
      this_00 = (json_pointer<std::__cxx11::string> *)(local_1a8 + 0x80);
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::to_string((string_t *)&local_2a0,
                  (json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
      iVar14._M_node = local_298._M_node;
      if (local_2a0.object != (object_t *)auStack_290) {
        operator_delete(local_2a0.object,
                        CONCAT17(auStack_290[7],
                                 CONCAT16(auStack_290[6],
                                          CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
      }
      if (iVar14._M_node == (_Rb_tree_node_base *)0x0) {
LAB_0011aada:
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,(json_uri *)local_1a8);
        p_Var2 = &(psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header;
        iVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                 ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                                   *)(psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_parent,(_Link_type)p_Var2,(_Base_ptr)&local_2a0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__k);
        if (local_2a0.object != (object_t *)auStack_290) {
          operator_delete(local_2a0.object,
                          CONCAT17(auStack_290[7],
                                   CONCAT16(auStack_290[6],
                                            CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
        }
        if ((_Rb_tree_header *)iVar23._M_node != p_Var2) {
          nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,(json_uri *)local_1a8);
          iVar17 = std::__cxx11::string::compare((string *)&local_2a0.boolean);
          if (local_2a0.object != (object_t *)auStack_290) {
            operator_delete(local_2a0.object,
                            CONCAT17(auStack_290[7],
                                     CONCAT16(auStack_290[6],
                                              CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
          }
          if (-1 < iVar17) {
            local_1c8._vptr_schema = *(_func_int ***)(iVar23._M_node + 2);
            local_1c8.root_ = (root_schema *)iVar23._M_node[2]._M_parent;
            goto LAB_0011a95b;
          }
        }
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_1e8,(json_uri *)local_1a8);
        nlohmann::json_uri::to_string_abi_cxx11_(&local_e8,(json_uri *)local_1a8);
        prVar35 = (root_schema *)operator_new(0x70);
        *(_Base_ptr *)((long)&(prVar35->loader_).super__Function_base._M_functor + 8) =
             (_Base_ptr)0x100000001;
        *(undefined ***)&(prVar35->loader_).super__Function_base._M_functor =
             &PTR___Sp_counted_ptr_inplace_001640c8;
        pp_Var39 = (_Base_ptr *)&(prVar35->loader_).super__Function_base._M_manager;
        schema_ref::schema_ref((schema_ref *)pp_Var39,&local_e8,prVar34);
        uVar15 = auStack_290._7_4_;
        auStack_290[6] = (undefined1)((ulong)local_1d8._0_8_ >> 0x30);
        auStack_290[7] = (undefined1)((ulong)local_1d8._0_8_ >> 0x38);
        auStack_290._4_2_ = (undefined2)((ulong)local_1d8._0_8_ >> 0x20);
        auStack_290._0_4_ = (undefined4)local_1d8._M_allocated_capacity;
        if (local_1e8.object == (object_t *)&local_1d8) {
          auStack_290._8_3_ = (undefined3)local_1d8._8_8_;
          auStack_290[0xb] = (undefined1)((ulong)local_1d8._8_8_ >> 0x18);
          auStack_290._12_4_ = (undefined4)((ulong)local_1d8._8_8_ >> 0x20);
          local_2a0.object = (object_t *)auStack_290;
        }
        else {
          local_2a0.string = local_1e8.string;
          auStack_290._8_3_ = SUB43(uVar15,1);
        }
        local_298._M_node = p_Stack_1e0;
        p_Stack_1e0 = (_Rb_tree_node_base *)0x0;
        local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
        local_280._M_p = (pointer)pp_Var39;
        prStack_278 = prVar35;
        local_1e8.object = (object_t *)&local_1d8;
        if ((_Rb_tree_header *)iVar23._M_node == p_Var2) {
          local_1c8.default_value_.m_value = (json_value)p_Var2;
          if (((psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (iVar17 = std::__cxx11::string::compare
                                 ((string *)
                                  ((psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_right + 1)), -1 < iVar17)) {
LAB_0011ad45:
            pVar44 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                     ::_M_get_insert_unique_pos(&(psVar26->unresolved)._M_t,(key_type *)&local_2a0);
          }
          else {
            p_Var37 = (psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_0011ad07:
            auVar11._8_8_ = 0;
            auVar11._0_8_ = p_Var37;
            pVar44 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar11 << 0x40);
          }
LAB_0011ad55:
          iVar23._M_node = pVar44.first;
          if (pVar44.second != (_Rb_tree_node_base *)0x0) {
LAB_0011ad64:
            bVar16 = true;
            if (((_Rb_tree_node_base *)local_1c8.default_value_.m_value.object != pVar44.second) &&
               (pVar44.first == (_Rb_tree_node_base *)0x0)) {
              std::__cxx11::string::compare((string *)&local_2a0.boolean);
              bVar16 = (bool)(extraout_var >> 7);
            }
            iVar23._M_node = (_Base_ptr)operator_new(0x50);
            *(_Base_ptr **)(iVar23._M_node + 1) = &iVar23._M_node[1]._M_left;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(iVar23._M_node + 1),local_2a0.object,
                       (long)&((_Alloc_hider *)&(local_298._M_node)->_M_color)->_M_p +
                       (long)local_2a0.object);
            prVar34 = prStack_278;
            prStack_278 = (root_schema *)0x0;
            *(pointer *)(iVar23._M_node + 2) = local_280._M_p;
            iVar23._M_node[2]._M_parent = (_Base_ptr)prVar34;
            local_280._M_p = (pointer)0x0;
            std::_Rb_tree_insert_and_rebalance
                      (bVar16,iVar23._M_node,pVar44.second,
                       (_Rb_tree_node_base *)local_1c8.default_value_.m_value.object);
            psVar1 = &(psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            *psVar1 = *psVar1 + 1;
          }
        }
        else {
          iVar17 = std::__cxx11::string::compare((string *)&local_2a0.boolean);
          if (iVar17 < 0) {
            p_Var37 = (psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar44.second = p_Var37;
            pVar44.first = p_Var37;
            local_1c8.default_value_.m_value = (json_value)p_Var2;
            if (p_Var37 == iVar23._M_node) goto LAB_0011ad55;
            uVar25 = std::_Rb_tree_decrement(iVar23._M_node);
            iVar17 = std::__cxx11::string::compare((string *)(uVar25 + 0x20));
            if (-1 < iVar17) goto LAB_0011ad45;
            pVar44.second = iVar23._M_node;
            pVar44.first = iVar23._M_node;
            if (*(long *)(uVar25 + 0x18) != 0) goto LAB_0011ad55;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = uVar25;
            pVar44 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar12 << 0x40);
            goto LAB_0011ad64;
          }
          iVar17 = std::__cxx11::string::compare((string *)(iVar23._M_node + 1));
          if (iVar17 < 0) {
            p_Var37 = (psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_1c8.default_value_.m_value = (json_value)p_Var2;
            if (p_Var37 == iVar23._M_node) goto LAB_0011ad07;
            p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar23._M_node);
            pVar44.second = p_Var24;
            pVar44.first = p_Var24;
            iVar17 = std::__cxx11::string::compare((string *)&local_2a0.boolean);
            if (-1 < iVar17) goto LAB_0011ad45;
            if ((iVar23._M_node)->_M_right == (_Base_ptr)0x0) {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = iVar23._M_node;
              pVar44 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar10 << 0x40)
              ;
              goto LAB_0011ad64;
            }
            goto LAB_0011ad55;
          }
        }
        local_1c8._vptr_schema = *(_func_int ***)(iVar23._M_node + 2);
        local_1c8.root_ = (root_schema *)iVar23._M_node[2]._M_parent;
        if (local_1c8.root_ != (root_schema *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pp_Var39 = (_Base_ptr *)
                       ((long)&((local_1c8.root_)->loader_).super__Function_base._M_functor + 8);
            *(int *)pp_Var39 = *(int *)pp_Var39 + 1;
            UNLOCK();
          }
          else {
            pp_Var39 = (_Base_ptr *)
                       ((long)&((local_1c8.root_)->loader_).super__Function_base._M_functor + 8);
            *(int *)pp_Var39 = *(int *)pp_Var39 + 1;
          }
        }
        if (prStack_278 != (root_schema *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prStack_278);
        }
        if (local_2a0.object != (object_t *)auStack_290) {
          operator_delete(local_2a0.object,
                          CONCAT17(auStack_290[7],
                                   CONCAT16(auStack_290[6],
                                            CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        uVar40 = local_1d8._M_allocated_capacity;
        jVar41 = local_1e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8.object == &local_1d8) goto LAB_0011ae95;
      }
      else {
        ptr = &psVar26->unknown_keywords;
        bVar16 = nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                 contains<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           (this_00,ptr);
        if (!bVar16) goto LAB_0011aada;
        schema_00 = nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                    get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              (this_00,ptr);
        local_1e8.object = (object_t *)0x0;
        p_Stack_1e0 = (_Rb_tree_node_base *)0x0;
        local_1d8._M_allocated_capacity = 0;
        nlohmann::json_uri::json_uri((json_uri *)&local_2a0,(json_uri *)local_1a8);
        __l._M_len = 1;
        __l._M_array = (iterator)&local_2a0;
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_c8,__l,(allocator_type *)&local_e8);
        __k = &local_1e8;
        make(&local_1c8,schema_00,prVar34,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__k,&local_c8);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_c8);
        nlohmann::json_uri::~json_uri((json_uri *)&local_2a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1e8);
        if (local_1c8._vptr_schema == (_func_int **)0x0) {
          if (local_1c8.root_ != (root_schema *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8.root_);
          }
          goto LAB_0011aada;
        }
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,(json_uri *)local_1a8);
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        erase_internal<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  (ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a0);
        if (local_2a0.object == (object_t *)auStack_290) goto LAB_0011ae95;
        uVar40 = CONCAT17(auStack_290[7],
                          CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)));
        jVar41 = local_2a0;
      }
      operator_delete(jVar41.object,uVar40 + 1);
    }
    else {
      local_1c8._vptr_schema = *(_func_int ***)(iVar27._M_node + 2);
      local_1c8.root_ = (root_schema *)iVar27._M_node[2]._M_parent;
LAB_0011a95b:
      if (local_1c8.root_ != (root_schema *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pp_Var39 = (_Base_ptr *)
                     ((long)&((local_1c8.root_)->loader_).super__Function_base._M_functor + 8);
          *(int *)pp_Var39 = *(int *)pp_Var39 + 1;
          UNLOCK();
        }
        else {
          pp_Var39 = (_Base_ptr *)
                     ((long)&((local_1c8.root_)->loader_).super__Function_base._M_functor + 8);
          *(int *)pp_Var39 = *(int *)pp_Var39 + 1;
        }
      }
    }
LAB_0011ae95:
    prVar35 = local_1c8.root_;
    pp_Var7 = local_1c8._vptr_schema;
    local_1c8._vptr_schema = (_func_int **)0x0;
    local_1c8.root_ = (root_schema *)0x0;
    prVar34 = this->root_;
    this->_vptr_schema = pp_Var7;
    this->root_ = prVar35;
    if ((prVar34 != (root_schema *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar34),
       local_1c8.root_ != (root_schema *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8.root_);
    }
    local_70.m_object = local_2c8.m_object;
    local_70.m_it.object_iterator._M_node = local_2c8.m_it.object_iterator._M_node;
    local_70.m_it.array_iterator._M_current = local_2c8.m_it.array_iterator._M_current;
    local_70.m_it.primitive_iterator.m_it = local_2c8.m_it.primitive_iterator.m_it;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
              ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&local_2a0,schema,&local_70);
    vVar3 = schema->m_type;
    prVar35 = (root_schema *)(ulong)vVar3;
    if (vVar3 == object) {
      local_2c8.m_it.object_iterator._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
           ::_M_find_tr<char[8],void>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       *)(schema->m_value).object,(char (*) [8])"default");
      prVar35 = (root_schema *)CONCAT71((int7)((ulong)prVar35 >> 8),schema->m_type);
      local_2c8.m_it.primitive_iterator.m_it = -0x8000000000000000;
LAB_0011af9a:
      local_2c8.m_it.array_iterator._M_current = (pointer)0x0;
      local_298._M_node = (_Rb_tree_node_base *)0x0;
      auStack_290._0_4_ = 0;
      auStack_290._4_2_ = 0;
      auStack_290[6] = '\0';
      auStack_290._7_4_ = 0;
      auStack_290._12_4_ = 0x80000000;
      if ((char)prVar35 == '\x02') goto LAB_0011afe5;
      if (((uint)prVar35 & 0xff) == 1) {
        local_298._M_node =
             &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        auStack_290._7_4_ = 0x100;
        auStack_290._12_4_ = 0;
      }
    }
    else {
      if (vVar3 != array) {
        local_2c8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_2c8.m_it.primitive_iterator.m_it = 1;
        goto LAB_0011af9a;
      }
      local_2c8.m_it.array_iterator._M_current =
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_2c8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_2c8.m_it.primitive_iterator.m_it = -0x8000000000000000;
      prVar35 = (root_schema *)schema;
LAB_0011afe5:
      auStack_290._12_4_ = 0x80000000;
      local_298._M_node = (_Rb_tree_node_base *)0x0;
      sVar6 = ((schema->m_value).string)->_M_string_length;
      auStack_290._0_4_ = (undefined4)sVar6;
      auStack_290._4_2_ = (undefined2)(sVar6 >> 0x20);
      auStack_290[6] = (undefined1)(sVar6 >> 0x30);
      auStack_290[7] = (undefined1)(sVar6 >> 0x38);
      auStack_290._8_3_ = 0;
    }
    auStack_290[0xb] = 0;
    local_2c8.m_object = schema;
    local_2a0 = (json_value)schema;
    bVar16 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       (&local_2c8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a0);
    prVar34 = local_2a8;
    if (!bVar16) {
      pp_Var7 = this->_vptr_schema;
      pbVar19 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&local_2c8);
      (**(code **)*pp_Var7)(&local_2a0,pp_Var7,this,prVar34,uris,pbVar19);
      prVar35 = prVar34;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.object !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        this->_vptr_schema = (_func_int **)local_2a0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->root_,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298);
        prVar35 = prVar34;
      }
      if (local_298._M_node != (_Rb_tree_node_base *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._M_node);
      }
      local_90.m_object = local_2c8.m_object;
      local_90.m_it.object_iterator._M_node = local_2c8.m_it.object_iterator._M_node;
      local_90.m_it.array_iterator._M_current = local_2c8.m_it.array_iterator._M_current;
      local_90.m_it.primitive_iterator.m_it = local_2c8.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_2a0,schema,&local_90);
    }
    nlohmann::json_uri::~json_uri((json_uri *)local_1a8);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[8],_0>(schema,(char (*) [8])"$schema");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[6],_0>(schema,(char (*) [6])"title");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[12],_0>(schema,(char (*) [12])"description");
  _Var38._M_pi = extraout_RDX_01;
LAB_0011b0e0:
  pjVar42 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pjVar8 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pjVar30 = pjVar8;
  if (pjVar42 != pjVar8) {
    local_1c8.default_value_.m_value.object = (object_t *)&this->root_;
    do {
      prVar34 = local_2a8;
      nlohmann::json_uri::location_abi_cxx11_((string *)&local_2a0,pjVar42);
      psVar26 = nlohmann::json_schema::root_schema::get_or_create_file(prVar34,(string *)&local_2a0)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.object !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_290) {
        operator_delete(local_2a0.object,
                        CONCAT17(auStack_290[7],
                                 CONCAT16(auStack_290[6],
                                          CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
      }
      nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,pjVar42);
      prVar34 = (root_schema *)&(psVar26->schemas)._M_t._M_impl.super__Rb_tree_header;
      iVar27 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
               ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                                 *)(psVar26->schemas)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent,(_Link_type)prVar34,(_Base_ptr)&local_2a0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )prVar35);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.object !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_290) {
        operator_delete(local_2a0.object,
                        CONCAT17(auStack_290[7],
                                 CONCAT16(auStack_290[6],
                                          CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
      }
      if ((root_schema *)iVar27._M_node != prVar34) {
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,pjVar42);
        iVar17 = std::__cxx11::string::compare((string *)&local_2a0.boolean);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0.object !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_290) {
          operator_delete(local_2a0.object,
                          CONCAT17(auStack_290[7],
                                   CONCAT16(auStack_290[6],
                                            CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
        }
        if (-1 < iVar17) {
          piVar31 = (invalid_argument *)__cxa_allocate_exception(0x10);
          nlohmann::json_uri::to_string_abi_cxx11_((string *)&local_1e8,pjVar42);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"schema with ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1e8);
          plVar32 = (long *)std::__cxx11::string::append(local_1a8);
          local_2a0.object = (object_t *)*plVar32;
          poVar36 = (object_t *)(plVar32 + 2);
          if (local_2a0.object == poVar36) {
            lVar9 = *(long *)&(poVar36->_M_t)._M_impl;
            lVar13 = plVar32[3];
            auStack_290._0_4_ = (undefined4)lVar9;
            auStack_290._4_2_ = (undefined2)((ulong)lVar9 >> 0x20);
            auStack_290[6] = (undefined1)((ulong)lVar9 >> 0x30);
            auStack_290[7] = (undefined1)((ulong)lVar9 >> 0x38);
            auStack_290._8_3_ = (undefined3)lVar13;
            auStack_290[0xb] = (undefined1)((ulong)lVar13 >> 0x18);
            auStack_290._12_4_ = (undefined4)((ulong)lVar13 >> 0x20);
            local_2a0.object = (object_t *)auStack_290;
          }
          else {
            lVar9 = *(long *)&(poVar36->_M_t)._M_impl;
            auStack_290._0_4_ = (undefined4)lVar9;
            auStack_290._4_2_ = (undefined2)((ulong)lVar9 >> 0x20);
            auStack_290[6] = (undefined1)((ulong)lVar9 >> 0x30);
            auStack_290[7] = (undefined1)((ulong)lVar9 >> 0x38);
          }
          local_298._M_node = (_Base_ptr)plVar32[1];
          *plVar32 = (long)poVar36;
          plVar32[1] = 0;
          *(undefined1 *)(plVar32 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar31,(string *)&local_2a0.boolean);
          __cxa_throw(piVar31,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      nlohmann::json_uri::fragment_abi_cxx11_((string *)local_1a8,pjVar42);
      uVar15 = auStack_290._7_4_;
      local_2a0.object = (object_t *)auStack_290;
      auStack_290[6] = SUB81(local_1a8._16_8_,6);
      auStack_290[7] = SUB81(local_1a8._16_8_,7);
      auStack_290._4_2_ = SUB82(local_1a8._16_8_,4);
      auStack_290._0_4_ = (undefined4)local_1a8._16_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        auStack_290._8_3_ = (undefined3)local_1a8._24_8_;
        auStack_290[0xb] = SUB81(local_1a8._24_8_,3);
        auStack_290._12_4_ = SUB84(local_1a8._24_8_,4);
      }
      else {
        local_2a0.object = (object_t *)local_1a8._0_8_;
        auStack_290._8_3_ = SUB43(uVar15,1);
      }
      local_298._M_node = (_Base_ptr)local_1a8._8_8_;
      local_1a8._8_8_ = (_Rb_tree_node_base *)0x0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_280._M_p = (pointer)this->_vptr_schema;
      prStack_278 = this->root_;
      prVar35 = (root_schema *)local_280._M_p;
      if (prStack_278 != (root_schema *)0x0) {
        prVar35 = (root_schema *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          pp_Var39 = (_Base_ptr *)
                     ((long)&(prStack_278->loader_).super__Function_base._M_functor + 8);
          *(int *)pp_Var39 = *(int *)pp_Var39 + 1;
          UNLOCK();
        }
        else {
          pp_Var39 = (_Base_ptr *)
                     ((long)&(prStack_278->loader_).super__Function_base._M_functor + 8);
          *(int *)pp_Var39 = *(int *)pp_Var39 + 1;
        }
      }
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1a8 + 0x10);
      pVar44 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
               ::_M_get_insert_unique_pos
                         ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                           *)psVar26,(key_type *)&local_2a0);
      p_Var24 = pVar44.second;
      if (p_Var24 != (_Rb_tree_node_base *)0x0) {
        bVar16 = true;
        if (prVar34 != (root_schema *)p_Var24 && pVar44.first == (_Rb_tree_node_base *)0x0) {
          std::__cxx11::string::compare((string *)&local_2a0.boolean);
          bVar16 = (bool)(extraout_var_00 >> 7);
        }
        p_Var28 = (_Rb_tree_node_base *)operator_new(0x50);
        *(_Base_ptr **)(p_Var28 + 1) = &p_Var28[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(p_Var28 + 1),local_2a0.object,
                   (long)&((_Alloc_hider *)&(local_298._M_node)->_M_color)->_M_p +
                   (long)local_2a0.object);
        prVar35 = prStack_278;
        prStack_278 = (root_schema *)0x0;
        *(pointer *)(p_Var28 + 2) = local_280._M_p;
        p_Var28[2]._M_parent = (_Base_ptr)prVar35;
        local_280._M_p = (pointer)0x0;
        std::_Rb_tree_insert_and_rebalance(bVar16,p_Var28,p_Var24,(_Rb_tree_node_base *)prVar34);
        psVar1 = &(psVar26->schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar1 = *psVar1 + 1;
        prVar35 = prVar34;
      }
      if (prStack_278 != (root_schema *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prStack_278);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.object !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_290) {
        operator_delete(local_2a0.object,
                        CONCAT17(auStack_290[7],
                                 CONCAT16(auStack_290[6],
                                          CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      nlohmann::json_uri::fragment_abi_cxx11_((string *)&local_2a0,pjVar42);
      iVar29 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
               ::find(&psVar26->unresolved,(key_type *)&local_2a0);
      _Var38._M_pi = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.object !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_290) {
        operator_delete(local_2a0.object,
                        CONCAT17(auStack_290[7],
                                 CONCAT16(auStack_290[6],
                                          CONCAT24(auStack_290._4_2_,auStack_290._0_4_))) + 1);
        _Var38._M_pi = extraout_RDX_03;
      }
      __p = (_Link_type)&(psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header;
      if ((_Link_type)iVar29._M_node != __p) {
        lVar9 = *(long *)(iVar29._M_node + 2);
        *(_func_int ***)(lVar9 + 0x40) = this->_vptr_schema;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(lVar9 + 0x48),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   local_1c8.default_value_.m_value.object);
        this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                   *)std::_Rb_tree_rebalance_for_erase(iVar29._M_node,(_Rb_tree_node_base *)__p);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
        ::_M_drop_node(this_01,__p);
        psVar1 = &(psVar26->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar1 = *psVar1 - 1;
        _Var38._M_pi = extraout_RDX_04;
      }
      pjVar30 = (pointer)schema;
      if (schema->m_type == object) {
        local_1e8 = (json_value)schema;
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&local_2a0,
                (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&local_1e8);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_1a8,
              (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_1e8);
        while (bVar16 = nlohmann::json_abi_v3_11_2::detail::
                        iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                  ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_2a0,
                                   (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)local_1a8), prVar34 = local_2a8, !bVar16) {
          key_00 = nlohmann::json_abi_v3_11_2::detail::
                   iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_2a0);
          prVar35 = (root_schema *)
                    nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_2a0);
          nlohmann::json_schema::root_schema::insert_unknown_keyword
                    (prVar34,pjVar42,key_00,(json *)prVar35);
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(local_2a0.object)->_M_t)->_M_local_buf[0] == '\x02') {
            lVar9 = CONCAT17(auStack_290[7],
                             CONCAT16(auStack_290[6],CONCAT24(auStack_290._4_2_,auStack_290._0_4_)))
                    + 0x10;
            auStack_290._0_4_ = (undefined4)lVar9;
            auStack_290._4_2_ = (undefined2)((ulong)lVar9 >> 0x20);
            auStack_290[6] = (undefined1)((ulong)lVar9 >> 0x30);
            auStack_290[7] = (undefined1)((ulong)lVar9 >> 0x38);
          }
          else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_2a0.object)->_M_t)->_M_local_buf[0] == '\x01') {
            local_298._M_node = (_Base_ptr)std::_Rb_tree_increment(local_298._M_node);
          }
          else {
            lVar9 = CONCAT44(auStack_290._12_4_,CONCAT13(auStack_290[0xb],auStack_290._8_3_)) + 1;
            auStack_290._8_3_ = (undefined3)lVar9;
            auStack_290[0xb] = (undefined1)((ulong)lVar9 >> 0x18);
            auStack_290._12_4_ = (undefined4)((ulong)lVar9 >> 0x20);
          }
          local_280._M_p = local_280._M_p + 1;
        }
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)local_1a8);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_2a0);
        pjVar30 = extraout_RAX;
        _Var38._M_pi = extraout_RDX_05;
      }
      pjVar42 = pjVar42 + 1;
    } while (pjVar42 != pjVar8);
  }
  sVar45.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var38._M_pi;
  sVar45.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pjVar30;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar45.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<schema> schema::make(json &schema,
                                     root_schema *root,
                                     const std::vector<std::string> &keys,
                                     std::vector<nlohmann::json_uri> uris)
{
	// remove URIs which contain plain name identifiers, as sub-schemas cannot be referenced
	for (auto uri = uris.begin(); uri != uris.end();)
		if (uri->identifier() != "")
			uri = uris.erase(uri);
		else
			uri++;

	// append to all URIs the keys for this sub-schema
	for (auto &key : keys)
		for (auto &uri : uris)
			uri = uri.append(key);

	std::shared_ptr<::schema> sch;

	// boolean schema
	if (schema.type() == json::value_t::boolean)
		sch = std::make_shared<boolean>(schema, root);
	else if (schema.type() == json::value_t::object) {

		auto attr = schema.find("$id"); // if $id is present, this schema can be referenced by this ID
		                                // as an additional URI
		if (attr != schema.end()) {
			if (std::find(uris.begin(),
			              uris.end(),
			              attr.value().get<std::string>()) == uris.end())
				uris.push_back(uris.back().derive(attr.value().get<std::string>())); // so add it to the list if it is not there already
			schema.erase(attr);
		}

		auto findDefinitions = [&](const std::string &defs) -> bool {
			attr = schema.find(defs);
			if (attr != schema.end()) {
				for (auto &def : attr.value().items())
					schema::make(def.value(), root, {defs, def.key()}, uris);
				schema.erase(attr);
				return true;
			}
			return false;
		};
		if (!findDefinitions("$defs")) {
			findDefinitions("definitions");
		}

		attr = schema.find("$ref");
		if (attr != schema.end()) { // this schema is a reference
			// the last one on the uri-stack is the last id seen before coming here,
			// so this is the origial URI for this reference, the $ref-value has thus be resolved from it
			auto id = uris.back().derive(attr.value().get<std::string>());
			sch = root->get_or_create_ref(id);

			schema.erase(attr);

			// special case where we break draft-7 and allow overriding of properties when a $ref is used
			attr = schema.find("default");
			if (attr != schema.end()) {
				// copy the referenced schema depending on the underlying type and modify the default value
				if (auto new_sch = sch->make_for_default_(sch, root, uris, attr.value())) {
					sch = new_sch;
				}
				schema.erase(attr);
			}
		} else {
			sch = std::make_shared<type_schema>(schema, root, uris);
		}

		schema.erase("$schema");
		schema.erase("title");
		schema.erase("description");
	} else {
		throw std::invalid_argument("invalid JSON-type for a schema for " + uris[0].to_string() + ", expected: boolean or object");
	}

	for (auto &uri : uris) { // for all URIs this schema is referenced by
		root->insert(uri, sch);

		if (schema.type() == json::value_t::object)
			for (auto &u : schema.items())
				root->insert_unknown_keyword(uri, u.key(), u.value()); // insert unknown keywords for later reference
	}
	return sch;
}